

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CECoordinates.cpp
# Opt level: O3

CECoordinates * __thiscall
CECoordinates::ConvertToICRS
          (CECoordinates *__return_storage_ptr__,CECoordinates *this,double jd,double longitude,
          double latitude,double elevation_m,double pressure_hPa,double temperature_celsius,
          double relative_humidity,double dut1,double xp,double yp,double wavelength_um)

{
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double glon;
  double glat;
  double extraout_XMM0_Qa_01;
  double zen;
  double extraout_XMM0_Qa_02;
  double extraout_XMM0_Qa_03;
  double ycoord_new;
  double xcoord_new;
  double local_b8;
  double local_b0;
  double local_a8;
  double local_a0;
  CEAngle local_98;
  double local_88;
  double local_80;
  double local_78;
  double local_70;
  double local_68;
  double local_60;
  CECoordinateType local_54;
  CEDate local_50;
  
  local_b0 = 0.0;
  local_b8 = 0.0;
  switch(this->coord_type_) {
  case CIRS:
    CppEphem::julian_date_J2000();
    (*this->_vptr_CECoordinates[5])(this);
    local_a0 = extraout_XMM0_Qa;
    CppEphem::julian_date_J2000();
    (*this->_vptr_CECoordinates[7])(this);
    local_a8 = extraout_XMM0_Qa_00;
    CEDate::CEDate(&local_50,jd,JD);
    local_98._vptr_CEAngle._0_4_ = 1;
    CIRS2ICRS(local_a0,local_a8,&local_b0,&local_b8,&local_50,(CEAngleType *)&local_98);
    CEDate::~CEDate(&local_50);
    break;
  case ICRS:
    CppEphem::julian_date_J2000();
    (*this->_vptr_CECoordinates[5])(this);
    local_b0 = extraout_XMM0_Qa_02;
    CppEphem::julian_date_J2000();
    (*this->_vptr_CECoordinates[7])(this);
    local_b8 = extraout_XMM0_Qa_03;
    break;
  case GALACTIC:
    CppEphem::julian_date_J2000();
    (*this->_vptr_CECoordinates[5])(this);
    CppEphem::julian_date_J2000();
    (*this->_vptr_CECoordinates[7])(this);
    local_50._vptr_CEDate._0_4_ = 1;
    Galactic2ICRS(glon,glat,&local_b0,&local_b8,(CEAngleType *)&local_50);
    break;
  case OBSERVED:
    local_a8 = pressure_hPa;
    local_a0 = temperature_celsius;
    local_80 = dut1;
    local_78 = relative_humidity;
    local_70 = longitude;
    local_68 = latitude;
    local_60 = elevation_m;
    CppEphem::julian_date_J2000();
    (*this->_vptr_CECoordinates[5])(this);
    local_88 = extraout_XMM0_Qa_01;
    CppEphem::julian_date_J2000();
    (*this->_vptr_CECoordinates[7])(this);
    Observed2ICRS(local_88,zen,&local_b0,&local_b8,jd,local_70,local_68,local_60,local_a8,local_a0,
                  local_78,local_80,xp,yp,wavelength_um);
  }
  CEAngle::CEAngle((CEAngle *)&local_50,&local_b0);
  CEAngle::CEAngle(&local_98,&local_b8);
  local_54 = ICRS;
  CECoordinates(__return_storage_ptr__,(CEAngle *)&local_50,&local_98,&local_54);
  CEAngle::~CEAngle(&local_98);
  CEAngle::~CEAngle((CEAngle *)&local_50);
  return __return_storage_ptr__;
}

Assistant:

CECoordinates CECoordinates::ConvertToICRS(double jd,
                            double longitude,
                            double latitude,
                            double elevation_m,
                            double pressure_hPa,
                            double temperature_celsius,
                            double relative_humidity,
                            double dut1,
                            double xp, double yp,
                            double wavelength_um)
{
    double xcoord_new(0.0);
    double ycoord_new(0.0);
    if (coord_type_ == CECoordinateType::CIRS) {
        CIRS2ICRS(XCoordinate_Rad(), YCoordinate_Rad(),
                  &xcoord_new, &ycoord_new, jd, CEAngleType::RADIANS) ;
    } else if (coord_type_ == CECoordinateType::ICRS) {
        xcoord_new = XCoordinate_Rad() ;
        ycoord_new = YCoordinate_Rad() ;
    } else if (coord_type_ == CECoordinateType::GALACTIC) {
        Galactic2ICRS(XCoordinate_Rad(), YCoordinate_Rad(),
                      &xcoord_new, &ycoord_new, CEAngleType::RADIANS) ;
    } else if (coord_type_ == CECoordinateType::OBSERVED) {
        Observed2ICRS(XCoordinate_Rad(), YCoordinate_Rad(),
                      &xcoord_new, &ycoord_new,
                      jd, longitude, latitude,
                      elevation_m, pressure_hPa,
                      temperature_celsius, relative_humidity,
                      dut1, xp, yp, wavelength_um) ;
    }
    
    return CECoordinates(xcoord_new, ycoord_new,
                         CECoordinateType::ICRS) ;
}